

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::RaiseScope(cmMakefile *this,string *var,char *varDef)

{
  cmake *pcVar1;
  bool bVar2;
  ostream *poVar3;
  cmVariableWatch *this_00;
  ostringstream m;
  string local_1b0;
  undefined1 local_190 [376];
  
  if (var->_M_string_length != 0) {
    bVar2 = cmStateSnapshot::RaiseScope(&this->StateSnapshot,var,varDef);
    if (bVar2) {
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      if (pcVar1 == (cmake *)0x0) {
        this_00 = (cmVariableWatch *)0x0;
      }
      else {
        this_00 = (pcVar1->VariableWatch)._M_t.
                  super___uniq_ptr_impl<cmVariableWatch,_std::default_delete<cmVariableWatch>_>._M_t
                  .super__Tuple_impl<0UL,_cmVariableWatch_*,_std::default_delete<cmVariableWatch>_>.
                  super__Head_base<0UL,_cmVariableWatch_*,_false>._M_head_impl;
      }
      if (this_00 != (cmVariableWatch *)0x0) {
        cmVariableWatch::VariableAccessed(this_00,var,3,varDef,this);
        return;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Cannot set \"",0xc);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_190,(var->_M_dataplus)._M_p,var->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"\": current scope has no parent.",0x1f);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
      std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
    }
  }
  return;
}

Assistant:

void cmMakefile::UpdateOutputToSourceMap(std::string const& output,
                                         cmSourceFile* source)
{
  OutputToSourceMap::iterator i = this->OutputToSource.find(output);
  if (i != this->OutputToSource.end()) {
    // Multiple custom commands produce the same output but may
    // be attached to a different source file (MAIN_DEPENDENCY).
    // LinearGetSourceFileWithOutput would return the first one,
    // so keep the mapping for the first one.
    //
    // TODO: Warn the user about this case.  However, the VS 8 generator
    // triggers it for separate generate.stamp rules in ZERO_CHECK and
    // individual targets.
    return;
  }
  this->OutputToSource[output] = source;
}